

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O1

void __thiscall
mxx::future<std::vector<int,_std::allocator<int>_>_>::future
          (future<std::vector<int,_std::allocator<int>_>_> *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_valid = false;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_ever_valid = false;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req._vptr_requests =
       (_func_int **)&PTR__requests_0013a228;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>).m_req.m_requests.
  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_future_base<std::vector<int,_std::allocator<int>_>_>)._vptr_future_base =
       (_func_int **)&PTR__future_0013a2c0;
  pvVar1 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  *(undefined8 *)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl = 0;
  *(pointer *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)((long)&(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl + 0x10) =
       (pointer)0x0;
  (this->m_data)._M_t.
  super___uniq_ptr_impl<std::vector<int,_std::allocator<int>_>,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>_*,_std::default_delete<std::vector<int,_std::allocator<int>_>_>_>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>_*,_false>._M_head_impl = pvVar1;
  return;
}

Assistant:

future() : impl::future_base<T>(), m_data(new T()) {}